

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxForLoop::DoResolve(FxForLoop *this,FCompileContext *ctx)

{
  BYTE BVar1;
  PString *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  FxBoolCast *this_00;
  FxExpression *pFVar4;
  FScriptPosition *other;
  bool bVar5;
  FString local_30;
  
  if ((this->super_FxLoopStatement).super_FxExpression.isresolved != false) {
    return (FxExpression *)this;
  }
  (this->super_FxLoopStatement).super_FxExpression.isresolved = true;
  if (this->Init == (FxExpression *)0x0) {
LAB_0053b03c:
    if (this->Condition != (FxExpression *)0x0) {
      iVar3 = (*this->Condition->_vptr_FxExpression[2])();
      this->Condition = (FxExpression *)CONCAT44(extraout_var_00,iVar3);
      if ((FxExpression *)CONCAT44(extraout_var_00,iVar3) == (FxExpression *)0x0) goto LAB_0053b168;
    }
    if (this->Iteration != (FxExpression *)0x0) {
      iVar3 = (*this->Iteration->_vptr_FxExpression[2])();
      this->Iteration = (FxExpression *)CONCAT44(extraout_var_01,iVar3);
      if ((FxExpression *)CONCAT44(extraout_var_01,iVar3) == (FxExpression *)0x0) goto LAB_0053b168;
    }
    if (this->Code != (FxExpression *)0x0) {
      iVar3 = (*this->Code->_vptr_FxExpression[2])();
      this->Code = (FxExpression *)CONCAT44(extraout_var_02,iVar3);
      if ((FxExpression *)CONCAT44(extraout_var_02,iVar3) == (FxExpression *)0x0) goto LAB_0053b168;
    }
    if (this->Condition != (FxExpression *)0x0) {
      if (this->Condition->ValueType != (PType *)TypeBool) {
        this_00 = (FxBoolCast *)FMemArena::Alloc(&FxAlloc,0x38);
        pFVar4 = this->Condition;
        (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370
        ;
        FScriptPosition::FScriptPosition
                  (&(this_00->super_FxExpression).ScriptPosition,&pFVar4->ScriptPosition);
        (this_00->super_FxExpression).ValueType = (PType *)0x0;
        (this_00->super_FxExpression).isresolved = false;
        (this_00->super_FxExpression).NeedResult = true;
        (this_00->super_FxExpression).ExprType = EFX_BoolCast;
        (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxBoolCast_0070f548;
        this_00->basex = pFVar4;
        (this_00->super_FxExpression).ValueType = (PType *)TypeBool;
        this_00->NeedValue = true;
        this->Condition = (FxExpression *)this_00;
        pFVar4 = FxBoolCast::Resolve(this_00,ctx);
        this->Condition = pFVar4;
        if (pFVar4 == (FxExpression *)0x0) goto LAB_0053b168;
      }
      iVar3 = (*this->Condition->_vptr_FxExpression[3])();
      if ((char)iVar3 != '\0') {
        pPVar2 = (PString *)this->Condition[1]._vptr_FxExpression;
        other = &this->Condition[1].ScriptPosition;
        if (pPVar2 == TypeString) {
          FString::AttachToOther(&local_30,&other->FileName);
        }
        else {
          local_30.Chars = (other->FileName).Chars;
        }
        BVar1 = (pPVar2->super_PBasicType).super_PType.RegType;
        if (BVar1 == '\x01') {
          bVar5 = (double)local_30.Chars != 0.0;
        }
        else if (BVar1 == '\0') {
          bVar5 = (int)local_30.Chars != 0;
        }
        else {
          bVar5 = false;
        }
        if (pPVar2 == TypeString) {
          FString::~FString(&local_30);
        }
        if (!bVar5) {
          pFVar4 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x28);
          pFVar4->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
          FScriptPosition::FScriptPosition
                    (&pFVar4->ScriptPosition,
                     &(this->super_FxLoopStatement).super_FxExpression.ScriptPosition);
          pFVar4->ValueType = (PType *)0x0;
          pFVar4->ExprType = EFX_Nop;
          pFVar4->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711e78;
          pFVar4->isresolved = true;
          pFVar4->NeedResult = true;
          (*(this->super_FxLoopStatement).super_FxExpression._vptr_FxExpression[1])(this);
          return pFVar4;
        }
        if (this->Condition != (FxExpression *)0x0) {
          (*this->Condition->_vptr_FxExpression[1])();
        }
        this->Condition = (FxExpression *)0x0;
      }
    }
    if (this->Code == (FxExpression *)0x0 && this->Condition == (FxExpression *)0x0) {
      FScriptPosition::Message
                (&(this->super_FxLoopStatement).super_FxExpression.ScriptPosition,0,
                 "Infinite empty loop");
    }
  }
  else {
    iVar3 = (*this->Init->_vptr_FxExpression[2])();
    this->Init = (FxExpression *)CONCAT44(extraout_var,iVar3);
    if ((FxExpression *)CONCAT44(extraout_var,iVar3) != (FxExpression *)0x0) goto LAB_0053b03c;
LAB_0053b168:
    (*(this->super_FxLoopStatement).super_FxExpression._vptr_FxExpression[1])(this);
    this = (FxForLoop *)0x0;
  }
  return (FxExpression *)this;
}

Assistant:

FxExpression *FxForLoop::DoResolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE_OPT(Init, ctx);
	SAFE_RESOLVE_OPT(Condition, ctx);
	SAFE_RESOLVE_OPT(Iteration, ctx);
	SAFE_RESOLVE_OPT(Code, ctx);

	if (Condition != nullptr)
	{
		if (Condition->ValueType != TypeBool)
		{
			Condition = new FxBoolCast(Condition);
			SAFE_RESOLVE(Condition, ctx);
		}

		if (Condition->isConstant())
		{
			if (static_cast<FxConstant *>(Condition)->GetValue().GetBool() == false)
			{ // Nothing happens
				FxExpression *nop = new FxNop(ScriptPosition);
				delete this;
				return nop;
			}
			else
			{ // "for (..; true; ..)"
				delete Condition;
				Condition = nullptr;
			}
		}
	}
	if (Condition == nullptr && Code == nullptr)
	{ // "for (..; ; ..) { }"
	  // Someone could be using this for testing.
		ScriptPosition.Message(MSG_WARNING, "Infinite empty loop");
	}

	return this;
}